

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::cov(Group *this,View *view)

{
  const_iterator view_00;
  bool bVar1;
  pointer pvVar2;
  _Mem *this_00;
  _Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> local_38;
  _Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> local_30;
  _Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> local_28;
  _Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false> local_20;
  const_iterator vg;
  View *view_local;
  Group *this_local;
  
  vg.super__Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false>._M_cur =
       (_Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false>)
       (_Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false>)view;
  std::__detail::_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)&local_20)
  ;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
       ::begin(&this->viewing_groups);
  std::__detail::_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)&local_28,
             (_Node_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)&local_30);
  local_20._M_cur = local_28._M_cur;
  while( true ) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
         ::end(&this->viewing_groups);
    bVar1 = std::__detail::operator!=(&local_20,&local_38);
    if (!bVar1) break;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::operator->
                       ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *
                        )&local_20);
    if ((pvVar2->second & 1U) != 0) {
      this_00 = _Mem::Get();
      view_00 = vg;
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::operator->
                         ((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>
                           *)&local_20);
      _Mem::inject_copy(this_00,(View *)view_00.
                                        super__Node_iterator_base<std::pair<r_exec::Group_*const,_bool>,_false>
                                        ._M_cur,pvVar2->first);
    }
    std::__detail::_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<r_exec::Group_*const,_bool>,_false,_false> *)
               &local_20);
  }
  return;
}

Assistant:

void Group::cov(View *view)
{
    std::unordered_map<Group *, bool>::const_iterator vg;

    for (vg = viewing_groups.begin(); vg != viewing_groups.end(); ++vg) {
        if (vg->second) { // cov==true, viewing group c-salient and c-active (otherwise it wouldn't be a viewing group).
            _Mem::Get()->inject_copy(view, vg->first);
        }
    }
}